

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

ly_set * lys_xpath_atomize(lys_node *ctx_node,lyxp_node_type ctx_node_type,char *expr,int options)

{
  int iVar1;
  lys_module *module;
  ly_set *set_00;
  ulong uVar2;
  long lVar3;
  uint options_00;
  undefined1 auStack_68 [8];
  lyxp_set set;
  
  if (ctx_node == (lys_node *)0x0 || expr == (char *)0x0) {
    set_00 = (ly_set *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_xpath_atomize");
  }
  else {
    if (ctx_node_type < LYXP_NODE_ELEM) {
      do {
        module = lys_node_module(ctx_node);
        ctx_node = lys_getnext((lys_node *)0x0,(lys_node *)0x0,module,0x100);
        if (ctx_node_type != LYXP_NODE_ROOT_CONFIG) break;
      } while ((ctx_node->flags & 2) != 0);
    }
    set.ht = (hash_table *)0x0;
    set.ctx_pos = 0;
    set.ctx_size = 0;
    set.val._8_8_ = 0;
    set.used = 0;
    set.size = 0;
    set._8_8_ = 0;
    set.val.nodes = (lyxp_set_node *)0x0;
    auStack_68 = (undefined1  [8])0x0;
    set.type = LYXP_SET_EMPTY;
    set._4_4_ = 0;
    if ((options & 1U) == 0) {
      if ((options & 2U) == 0) {
        options_00 = options | 4;
      }
      else {
        options_00 = options & 0xffffffecU | 0x10;
      }
    }
    else {
      options_00 = options & 0xfffffff6U | 8;
    }
    iVar1 = lyxp_atomize(expr,ctx_node,ctx_node_type,(lyxp_set *)auStack_68,options_00,
                         (lys_node **)0x0);
    if (iVar1 == 0) {
      lVar3 = 8;
      set_00 = ly_set_new();
      for (uVar2 = 0; uVar2 < (set.val._8_8_ & 0xffffffff); uVar2 = uVar2 + 1) {
        if ((*(int *)(set._8_8_ + lVar3) == 2) &&
           (iVar1 = ly_set_add(set_00,*(void **)(set._8_8_ + -8 + lVar3),1), iVar1 == -1)) {
          ly_set_free(set_00);
          free((void *)set._8_8_);
          return (ly_set *)0x0;
        }
        lVar3 = lVar3 + 0x10;
      }
      free((void *)set._8_8_);
    }
    else {
      free((void *)set._8_8_);
      set_00 = (ly_set *)0x0;
      ly_vlog(ctx_node->module->ctx,LYE_SPEC,LY_VLOG_LYS,ctx_node,
              "Resolving XPath expression \"%s\" failed.",expr);
    }
  }
  return set_00;
}

Assistant:

ly_set *
lys_xpath_atomize(const struct lys_node *ctx_node, enum lyxp_node_type ctx_node_type, const char *expr, int options)
{
    struct lyxp_set set;
    struct ly_set *ret_set;
    uint32_t i;

    if (!ctx_node || !expr) {
        LOGARG;
        return NULL;
    }

    /* adjust the root */
    if ((ctx_node_type == LYXP_NODE_ROOT) || (ctx_node_type == LYXP_NODE_ROOT_CONFIG)) {
        do {
            ctx_node = lys_getnext(NULL, NULL, lys_node_module(ctx_node), LYS_GETNEXT_NOSTATECHECK);
        } while ((ctx_node_type == LYXP_NODE_ROOT_CONFIG) && (ctx_node->flags & LYS_CONFIG_R));
    }

    memset(&set, 0, sizeof set);

    if (options & LYXP_MUST) {
        options &= ~LYXP_MUST;
        options |= LYXP_SNODE_MUST;
    } else if (options & LYXP_WHEN) {
        options &= ~LYXP_WHEN;
        options |= LYXP_SNODE_WHEN;
    } else {
        options |= LYXP_SNODE;
    }

    if (lyxp_atomize(expr, ctx_node, ctx_node_type, &set, options, NULL)) {
        free(set.val.snodes);
        LOGVAL(ctx_node->module->ctx, LYE_SPEC, LY_VLOG_LYS, ctx_node, "Resolving XPath expression \"%s\" failed.", expr);
        return NULL;
    }

    ret_set = ly_set_new();

    for (i = 0; i < set.used; ++i) {
        switch (set.val.snodes[i].type) {
        case LYXP_NODE_ELEM:
            if (ly_set_add(ret_set, set.val.snodes[i].snode, LY_SET_OPT_USEASLIST) == -1) {
                ly_set_free(ret_set);
                free(set.val.snodes);
                return NULL;
            }
            break;
        default:
            /* ignore roots, text and attr should not ever appear */
            break;
        }
    }

    free(set.val.snodes);
    return ret_set;
}